

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O1

bool __thiscall
SID::set_sampling_parameters
          (SID *this,double clock_freq,sampling_method method,double sample_freq,double pass_freq,
          double filter_scale)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  short *psVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  if ((method & ~SAMPLE_INTERPOLATE) == SAMPLE_RESAMPLE_INTERPOLATE) {
    if (16384.0 <= (clock_freq * 125.0) / sample_freq) {
      return false;
    }
    if (0.0 <= pass_freq) {
      if (sample_freq * 0.9 * 0.5 < pass_freq) {
        return false;
      }
    }
    else if (0.9 <= 40000.0 / sample_freq) {
      pass_freq = sample_freq * 0.9 * 0.5;
    }
    else {
      pass_freq = 20000.0;
    }
    if (filter_scale < 0.9) {
      return false;
    }
    if (1.0 < filter_scale) {
      return false;
    }
  }
  this->clock_frequency = clock_freq;
  dVar16 = clock_freq / sample_freq;
  this->sampling = method;
  this->cycles_per_sample = (int)(dVar16 * 65536.0 + 0.5);
  this->sample_offset = 0;
  this->sample_prev = 0;
  if (method + ~SAMPLE_RESAMPLE_FAST < 0xfffffffe) {
    if (this->sample != (short *)0x0) {
      operator_delete__(this->sample);
    }
    if (this->fir != (short *)0x0) {
      operator_delete__(this->fir);
    }
    this->sample = (short *)0x0;
    this->fir = (short *)0x0;
  }
  else {
    dVar13 = (pass_freq + pass_freq) / sample_freq;
    dVar11 = 1.0;
    iVar2 = 1;
    dVar17 = 1.0;
    do {
      dVar15 = (double)iVar2;
      iVar2 = iVar2 + 1;
      dVar11 = dVar11 * (4.828390883547317 / dVar15) * (4.828390883547317 / dVar15);
      dVar17 = dVar17 + dVar11;
    } while (dVar17 * 1e-06 <= dVar11);
    uVar3 = (uint)(88.37959861247398 / ((1.0 - dVar13) * 3.141592653589793 * 2.285) + 0.5);
    iVar2 = 0xc911;
    if (method == SAMPLE_RESAMPLE_INTERPOLATE) {
      iVar2 = 0x11d;
    }
    this->fir_N = (int)((double)(int)((uVar3 & 1) + uVar3) * dVar16) + 1U | 1;
    dVar11 = log((double)iVar2 / dVar16);
    dVar11 = ceil(dVar11 / 0.6931471805599453);
    this->fir_RES = 1 << ((byte)(int)dVar11 & 0x1f);
    if (this->fir != (short *)0x0) {
      operator_delete__(this->fir);
    }
    lVar6 = (long)this->fir_RES * (long)this->fir_N;
    uVar10 = 0xffffffffffffffff;
    if (-1 < (int)lVar6) {
      uVar10 = lVar6 * 2;
    }
    psVar4 = (short *)operator_new__(uVar10);
    this->fir = psVar4;
    iVar2 = this->fir_RES;
    if (0 < iVar2) {
      dVar11 = (dVar13 + 1.0) * 3.141592653589793 * 0.5;
      iVar8 = 0;
      do {
        iVar5 = this->fir_N / 2;
        iVar9 = -iVar5;
        if (iVar9 == iVar5 || SBORROW4(iVar9,iVar5) != iVar5 * -2 < 0) {
          iVar7 = iVar5 + this->fir_N * iVar8;
          lVar6 = (long)iVar9;
          do {
            dVar13 = (double)(int)lVar6 - (double)iVar8 / (double)iVar2;
            dVar15 = dVar13 / (double)iVar5;
            dVar18 = 0.0;
            if (ABS(dVar15) <= 1.0) {
              dVar15 = 1.0 - dVar15 * dVar15;
              if (dVar15 < 0.0) {
                dVar15 = sqrt(dVar15);
              }
              else {
                dVar15 = SQRT(dVar15);
              }
              iVar5 = 1;
              dVar12 = 1.0;
              dVar18 = 1.0;
              do {
                dVar14 = (double)iVar5;
                iVar5 = iVar5 + 1;
                dVar14 = (dVar15 * 9.656781767094634 * 0.5) / dVar14;
                dVar12 = dVar12 * dVar14 * dVar14;
                dVar18 = dVar18 + dVar12;
              } while (dVar18 * 1e-06 <= dVar12);
              dVar18 = dVar18 / dVar17;
            }
            dVar15 = (dVar13 * dVar11) / dVar16;
            dVar13 = 1.0;
            if (1e-06 <= ABS(dVar15)) {
              dVar13 = sin(dVar15);
              dVar13 = dVar13 / dVar15;
            }
            this->fir[lVar6 + iVar7] =
                 (short)(int)(dVar18 * dVar13 * ((filter_scale * 32768.0 *
                                                  (sample_freq / clock_freq) * dVar11) /
                                                3.141592653589793) + 0.5);
            iVar5 = this->fir_N / 2;
            bVar1 = lVar6 < iVar5;
            lVar6 = lVar6 + 1;
          } while (bVar1);
        }
        iVar8 = iVar8 + 1;
        iVar2 = this->fir_RES;
      } while (iVar8 < iVar2);
    }
    if (this->sample == (short *)0x0) {
      psVar4 = (short *)operator_new__(0x10000);
      this->sample = psVar4;
    }
    memset(this->sample,0,0x10000);
    this->sample_index = 0;
  }
  return true;
}

Assistant:

bool SID::set_sampling_parameters(double clock_freq, sampling_method method,
				  double sample_freq, double pass_freq,
				  double filter_scale)
{
  // Check resampling constraints.
  if (method == SAMPLE_RESAMPLE_INTERPOLATE || method == SAMPLE_RESAMPLE_FAST)
  {
    // Check whether the sample ring buffer would overfill.
    if (FIR_N*clock_freq/sample_freq >= RINGSIZE) {
      return false;
    }

    // The default passband limit is 0.9*sample_freq/2 for sample
    // frequencies below ~ 44.1kHz, and 20kHz for higher sample frequencies.
    if (pass_freq < 0) {
      pass_freq = 20000;
      if (2*pass_freq/sample_freq >= 0.9) {
	pass_freq = 0.9*sample_freq/2;
      }
    }
    // Check whether the FIR table would overfill.
    else if (pass_freq > 0.9*sample_freq/2) {
      return false;
    }

    // The filter scaling is only included to avoid clipping, so keep
    // it sane.
    if (filter_scale < 0.9 || filter_scale > 1.0) {
      return false;
    }
  }

  clock_frequency = clock_freq;
  sampling = method;

  cycles_per_sample =
    cycle_count(clock_freq/sample_freq*(1 << FIXP_SHIFT) + 0.5);

  sample_offset = 0;
  sample_prev = 0;

  // FIR initialization is only necessary for resampling.
  if (method != SAMPLE_RESAMPLE_INTERPOLATE && method != SAMPLE_RESAMPLE_FAST)
  {
    delete[] sample;
    delete[] fir;
    sample = 0;
    fir = 0;
    return true;
  }

  const double pi = 3.1415926535897932385;

  // 16 bits -> -96dB stopband attenuation.
  const double A = -20*log10(1.0/(1 << 16));
  // A fraction of the bandwidth is allocated to the transition band,
  double dw = (1 - 2*pass_freq/sample_freq)*pi;
  // The cutoff frequency is midway through the transition band.
  double wc = (2*pass_freq/sample_freq + 1)*pi/2;

  // For calculation of beta and N see the reference for the kaiserord
  // function in the MATLAB Signal Processing Toolbox:
  // http://www.mathworks.com/access/helpdesk/help/toolbox/signal/kaiserord.html
  const double beta = 0.1102*(A - 8.7);
  const double I0beta = I0(beta);

  // The filter order will maximally be 124 with the current constraints.
  // N >= (96.33 - 7.95)/(2.285*0.1*pi) -> N >= 123
  // The filter order is equal to the number of zero crossings, i.e.
  // it should be an even number (sinc is symmetric about x = 0).
  int N = int((A - 7.95)/(2.285*dw) + 0.5);
  N += N & 1;

  double f_samples_per_cycle = sample_freq/clock_freq;
  double f_cycles_per_sample = clock_freq/sample_freq;

  // The filter length is equal to the filter order + 1.
  // The filter length must be an odd number (sinc is symmetric about x = 0).
  fir_N = int(N*f_cycles_per_sample) + 1;
  fir_N |= 1;

  // We clamp the filter table resolution to 2^n, making the fixpoint
  // sample_offset a whole multiple of the filter table resolution.
  int res = method == SAMPLE_RESAMPLE_INTERPOLATE ?
    FIR_RES_INTERPOLATE : FIR_RES_FAST;
  int n = (int)ceil(log(res/f_cycles_per_sample)/log(2));
  fir_RES = 1 << n;

  // Allocate memory for FIR tables.
  delete[] fir;
  fir = new short[fir_N*fir_RES];

  // Calculate fir_RES FIR tables for linear interpolation.
  for (int i = 0; i < fir_RES; i++) {
    int fir_offset = i*fir_N + fir_N/2;
    double j_offset = double(i)/fir_RES;
    // Calculate FIR table. This is the sinc function, weighted by the
    // Kaiser window.
    for (int j = -fir_N/2; j <= fir_N/2; j++) {
      double jx = j - j_offset;
      double wt = wc*jx/f_cycles_per_sample;
      double temp = jx/(fir_N/2);
      double Kaiser =
	fabs(temp) <= 1 ? I0(beta*sqrt(1 - temp*temp))/I0beta : 0;
      double sincwt =
	fabs(wt) >= 1e-6 ? sin(wt)/wt : 1;
      double val =
	(1 << FIR_SHIFT)*filter_scale*f_samples_per_cycle*wc/pi*sincwt*Kaiser;
      fir[fir_offset + j] = short(val + 0.5);
    }
  }

  // Allocate sample buffer.
  if (!sample) {
    sample = new short[RINGSIZE*2];
  }
  // Clear sample buffer.
  for (int j = 0; j < RINGSIZE*2; j++) {
    sample[j] = 0;
  }
  sample_index = 0;

  return true;
}